

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O3

string * __thiscall
absl::time_internal::cctz::TimeZoneInfo::Version_abi_cxx11_
          (string *__return_storage_ptr__,TimeZoneInfo *this)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (this->version_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->version_)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string TimeZoneInfo::Version() const { return version_; }